

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O2

Token __thiscall slang::parsing::Parser::parseEdgeKeyword(Parser *this)

{
  TokenKind TVar1;
  Token TVar2;
  Token local_18;
  
  TVar2 = ParserBase::peek(&this->super_ParserBase);
  TVar1 = TVar2.kind;
  if (((TVar1 == EdgeKeyword) || (TVar1 == PosEdgeKeyword)) || (TVar1 == NegEdgeKeyword)) {
    local_18 = ParserBase::consume(&this->super_ParserBase);
  }
  else {
    Token::Token(&local_18);
  }
  return local_18;
}

Assistant:

Token Parser::parseEdgeKeyword() {
    switch (peek().kind) {
        case TokenKind::EdgeKeyword:
        case TokenKind::PosEdgeKeyword:
        case TokenKind::NegEdgeKeyword:
            return consume();
        default:
            return Token();
    }
}